

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquerymodel_p.h
# Opt level: O1

int QSqlQueryModelSql::select
              (int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
              timeval *__timeout)

{
  int *piVar1;
  QArrayData *pQVar2;
  QString *pQVar3;
  undefined8 *puVar4;
  undefined4 in_register_0000003c;
  long *plVar5;
  __fd_mask *p_Var6;
  __fd_mask *p_Var7;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  QLatin1String QVar9;
  long local_58;
  __fd_mask local_50;
  QArrayData *local_48;
  __fd_mask local_40;
  long local_38;
  long local_30;
  
  plVar5 = (long *)CONCAT44(in_register_0000003c,__nfds);
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var6 = __readfds->fds_bits + 2;
  QVar8.m_data = (storage_type *)0x6;
  QVar8.m_size = (qsizetype)&local_48;
  QString::fromLatin1(QVar8);
  pQVar2 = local_48;
  local_50 = local_40;
  local_58 = local_38;
  if (local_38 == 0) {
    local_48 = (QArrayData *)__readfds->fds_bits[0];
    p_Var7 = __readfds->fds_bits + 1;
  }
  else {
    if (*p_Var6 != 0) {
      if (local_48 != (QArrayData *)0x0) {
        LOCK();
        (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_48->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QVar9.m_data = (char *)0x1;
      QVar9.m_size = (qsizetype)&local_48;
      pQVar3 = (QString *)QString::append(QVar9);
      puVar4 = (undefined8 *)QString::append(pQVar3);
      piVar1 = (int *)*puVar4;
      *plVar5 = (long)piVar1;
      plVar5[1] = puVar4[1];
      plVar5[2] = puVar4[2];
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      if (local_48 != (QArrayData *)0x0) {
        LOCK();
        (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_48,2,0x10);
        }
      }
      goto LAB_00135923;
    }
    p_Var7 = &local_50;
    p_Var6 = &local_58;
  }
  *plVar5 = (long)local_48;
  plVar5[1] = *p_Var7;
  plVar5[2] = *p_Var6;
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
LAB_00135923:
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __nfds;
  }
  __stack_chk_fail();
}

Assistant:

inline const static QString select(const QString &s) { return concat(select(), s); }